

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O1

int http_parser_parse_url(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  int iVar4;
  state s;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint16_t *puVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  bool bVar15;
  
  iVar5 = 1;
  if (buflen != 0) {
    u->field_set = 0;
    u->port = 0;
    if ((long)buflen < 1) {
      iVar12 = 4;
    }
    else {
      s = (uint)(is_connect != 0) * 4 + s_req_spaces_before_url;
      uVar11 = 7;
      lVar14 = 0;
      bVar15 = false;
      do {
        s = parse_url_char(s,buf[lVar14]);
        switch(s) {
        case s_req_schema:
          uVar6 = 0;
          break;
        case s_req_schema_slash:
        case s_req_schema_slash_slash:
        case s_req_server_start:
        case s_req_query_string_start:
        case s_req_fragment_start:
          goto switchD_00151759_caseD_16;
        case s_req_server:
          uVar6 = 1;
          break;
        case s_req_server_with_at:
          uVar6 = 1;
          bVar15 = true;
          break;
        case s_req_path:
          uVar6 = 3;
          break;
        case s_req_query_string:
          uVar6 = 4;
          break;
        case s_req_fragment:
          uVar6 = 5;
          break;
        default:
          return 1;
        }
        if (uVar6 == uVar11) {
          puVar9 = &u->field_data[uVar6].len;
          *puVar9 = *puVar9 + 1;
        }
        else {
          u->field_data[uVar6].off = (uint16_t)lVar14;
          u->field_data[uVar6].len = 1;
          u->field_set = u->field_set | (ushort)(1 << (sbyte)uVar6);
          uVar11 = uVar6;
        }
switchD_00151759_caseD_16:
        lVar3 = lVar14 + 1;
        lVar14 = lVar14 + 1;
      } while (buf + lVar3 < buf + buflen);
      iVar12 = (uint)!bVar15 * 2 + 2;
    }
    iVar5 = 1;
    if ((u->field_set & 3) != 1) {
      if ((u->field_set & 2) != 0) {
        uVar8 = (ulong)u->field_data[1].off;
        uVar7 = (ulong)u->field_data[1].len;
        u->field_data[1].len = 0;
        if (uVar7 != 0) {
          lVar14 = uVar7 + uVar8;
          puVar9 = &u->field_data[6].len;
          do {
            if (10 < iVar12 - 2U) goto LAB_00151a43;
            bVar1 = buf[uVar8];
            uVar11 = (uint)bVar1;
            switch(iVar12) {
            default:
              if (uVar11 == 0x40) {
                iVar4 = 4;
                break;
              }
              bVar15 = false;
              iVar13 = 3;
              if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 | 0x20) + 0x9f))) {
                bVar15 = false;
                iVar4 = 3;
                if ((bVar1 - 0x21 < 0x3f) &&
                   (puVar9 = (uint16_t *)0x4000000016003ff9,
                   (0x4000000016003ff9U >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) != 0))
                goto LAB_00151a4c;
                goto LAB_001519dc;
              }
              goto LAB_00151a4c;
            case 4:
              if (uVar11 == 0x5b) {
                iVar4 = 5;
              }
              else {
                iVar4 = 6;
                if ((0x19 < (byte)((bVar1 | 0x20) + 0x9f)) &&
                   (1 < (byte)(bVar1 - 0x2d) && 9 < (byte)(bVar1 - 0x30))) goto LAB_00151a43;
              }
              break;
            case 5:
switchD_0015185c_caseD_5:
              iVar13 = 7;
              iVar4 = 7;
              if (9 < (byte)(bVar1 - 0x30)) {
                if ((bVar1 | 0x20) < 0x61) {
                  bVar15 = false;
                  if ((uVar11 == 0x2e) || (uVar11 == 0x3a)) goto LAB_00151a4c;
                }
                else if ((bVar1 | 0x20) < 0x67) break;
                if ((iVar12 == 7) && (bVar1 == 0x25)) {
                  bVar15 = false;
                  iVar13 = 9;
                  goto LAB_00151a4c;
                }
                goto LAB_00151a43;
              }
              break;
            case 6:
              iVar4 = 6;
              if ((0x19 < (byte)((bVar1 | 0x20) + 0x9f)) &&
                 (1 < (byte)(bVar1 - 0x2d) && 9 < (byte)(bVar1 - 0x30)))
              goto switchD_0015185c_caseD_8;
              break;
            case 7:
              if (uVar11 != 0x5d) goto switchD_0015185c_caseD_5;
LAB_0015198b:
              iVar4 = 8;
              break;
            case 8:
switchD_0015185c_caseD_8:
              if (uVar11 != 0x3a) goto LAB_00151a43;
              iVar4 = 0xb;
              break;
            case 9:
              goto switchD_0015185c_caseD_9;
            case 10:
              if (uVar11 == 0x5d) goto LAB_0015198b;
              goto switchD_0015185c_caseD_9;
            case 0xb:
            case 0xc:
              if (9 < (byte)(bVar1 - 0x30)) goto LAB_00151a43;
              iVar4 = 0xc;
            }
            iVar13 = iVar4;
            bVar15 = false;
LAB_00151a4c:
            if ((!bVar15) && (iVar12 = iVar13, iVar13 - 3U < 10)) {
              iVar5 = (*(code *)(&DAT_0018c484 + *(int *)(&DAT_0018c484 + (ulong)(iVar13 - 3U) * 4))
                      )(&u->field_data[2].len,puVar9,&u->field_data[1].len);
              return iVar5;
            }
            if (bVar15) {
              return 1;
            }
            lVar3 = uVar8 + 1;
            uVar8 = uVar8 + 1;
          } while (buf + lVar3 < buf + lVar14);
        }
        if ((iVar12 - 2U < 10) && ((0x3afU >> (iVar12 - 2U & 0x1f) & 1) != 0)) {
          return 1;
        }
      }
      if ((is_connect == 0) || (u->field_set == 6)) {
        if ((u->field_set & 4) != 0) {
          uVar7 = (ulong)u->field_data[2].len;
          bVar15 = uVar7 != 0;
          if (uVar7 == 0) {
            uVar8 = 0;
LAB_00151b7f:
            u->port = (uint16_t)uVar8;
          }
          else {
            uVar2 = u->field_data[2].off;
            uVar8 = (long)buf[uVar2] - 0x30;
            if (uVar8 < 0x10000) {
              pcVar10 = buf + uVar2;
              do {
                pcVar10 = pcVar10 + 1;
                bVar15 = pcVar10 < buf + uVar2 + uVar7;
                if (!bVar15) goto LAB_00151b7f;
                uVar8 = ((long)*pcVar10 + uVar8 * 10) - 0x30;
              } while (uVar8 < 0x10000);
            }
          }
          if (bVar15) {
            return 1;
          }
        }
        iVar5 = 0;
      }
    }
  }
  return iVar5;
switchD_0015185c_caseD_9:
  bVar15 = false;
  iVar13 = 10;
  if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 | 0x20) + 0x9f))) {
    bVar15 = false;
    iVar4 = 10;
    if ((0x3a < uVar11 - 0x25) ||
       (puVar9 = (uint16_t *)0x400000000000301,
       (0x400000000000301U >> ((ulong)(uVar11 - 0x25) & 0x3f) & 1) == 0)) {
LAB_001519dc:
      iVar13 = iVar4;
      bVar15 = false;
      if (uVar11 != 0x7e) {
LAB_00151a43:
        iVar13 = 1;
        bVar15 = true;
      }
    }
  }
  goto LAB_00151a4c;
}

Assistant:

int
http_parser_parse_url(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  if (buflen == 0) {
    return 1;
  }

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* fall through */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = (uint16_t)(p - buf);
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & (1 << UF_SCHEMA)) &&
      (u->field_set & (1 << UF_HOST)) == 0) {
    return 1;
  }

  if (u->field_set & (1 << UF_HOST)) {
    if (http_parse_host(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    uint16_t off;
    uint16_t len;
    const char* p;
    const char* end;
    unsigned long v;

    off = u->field_data[UF_PORT].off;
    len = u->field_data[UF_PORT].len;
    end = buf + off + len;

    /* NOTE: The characters are already validated and are in the [0-9] range */
    assert(off + len <= buflen && "Port number overflow");
    v = 0;
    for (p = buf + off; p < end; p++) {
      v *= 10;
      v += *p - '0';

      /* Ports have a max value of 2^16 */
      if (v > 0xffff) {
        return 1;
      }
    }

    u->port = (uint16_t) v;
  }

  return 0;
}